

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCapsuleShape.cpp
# Opt level: O3

cbtVector3 __thiscall
cbtCapsuleShape::localGetSupportingVertexWithoutMargin(cbtCapsuleShape *this,cbtVector3 *vec0)

{
  float fVar1;
  float fVar2;
  cbtScalar cVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  cbtVector3 cVar18;
  undefined1 local_18 [16];
  
  fVar12 = vec0->m_floats[1];
  fVar1 = vec0->m_floats[0];
  fVar2 = vec0->m_floats[2];
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),ZEXT416((uint)fVar1),
                            ZEXT416((uint)fVar1));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
  if (0.0001 <= auVar11._0_4_) {
    auVar11 = vsqrtss_avx(auVar11,auVar11);
    fVar14 = 1.0 / auVar11._0_4_;
    auVar11 = ZEXT416((uint)(fVar1 * fVar14));
    fVar12 = fVar12 * fVar14;
    auVar13 = ZEXT416((uint)(fVar2 * fVar14));
  }
  else {
    auVar11 = SUB6416(ZEXT464(0x3f800000),0);
    fVar12 = 0.0;
    auVar13._0_12_ = ZEXT812(0);
    auVar13._12_4_ = 0;
  }
  auVar8._0_12_ = ZEXT812(0);
  auVar8._12_4_ = 0;
  lVar6 = (long)*(int *)&(this->super_cbtConvexInternalShape).field_0x44;
  cVar3 = (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[lVar6];
  local_18 = auVar8;
  *(cbtScalar *)(local_18 + lVar6 * 4) = cVar3;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_18._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_18._8_8_;
  auVar4 = vmovshdup_avx(auVar7);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * auVar4._0_4_)),auVar11,auVar7);
  auVar4 = vfmadd231ss_fma(auVar4,auVar13,auVar17);
  uVar15 = local_18._0_8_;
  uVar16 = local_18._8_8_;
  if (auVar4._0_4_ <= -1e+18) {
    uVar15 = 0;
    uVar16 = 0;
  }
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar7 = vxorps_avx512vl(ZEXT416((uint)cVar3),auVar5);
  auVar4 = vmaxss_avx(auVar4,SUB6416(ZEXT464(0xdd5e0b6b),0));
  local_18 = auVar8;
  *(int *)(local_18 + lVar6 * 4) = auVar7._0_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_18._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_18._8_8_;
  auVar8 = vmovshdup_avx(auVar9);
  auVar11 = vfmadd213ss_fma(auVar11,auVar9,ZEXT416((uint)(auVar8._0_4_ * fVar12)));
  auVar11 = vfmadd213ss_fma(auVar13,auVar10,auVar11);
  if (auVar11._0_4_ <= auVar4._0_4_) {
    local_18._0_8_ = uVar15;
    local_18._8_8_ = uVar16;
  }
  cVar18.m_floats[2] = (cbtScalar)(int)local_18._8_8_;
  cVar18.m_floats[3] = (cbtScalar)(int)((ulong)local_18._8_8_ >> 0x20);
  cVar18.m_floats[0] = (cbtScalar)(int)local_18._0_8_;
  cVar18.m_floats[1] = (cbtScalar)(int)((ulong)local_18._0_8_ >> 0x20);
  return (cbtVector3)cVar18.m_floats;
}

Assistant:

cbtVector3 cbtCapsuleShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0) const
{
	cbtVector3 supVec(0, 0, 0);

	cbtScalar maxDot(cbtScalar(-BT_LARGE_FLOAT));

	cbtVector3 vec = vec0;
	cbtScalar lenSqr = vec.length2();
	if (lenSqr < cbtScalar(0.0001))
	{
		vec.setValue(1, 0, 0);
	}
	else
	{
		cbtScalar rlen = cbtScalar(1.) / cbtSqrt(lenSqr);
		vec *= rlen;
	}

	cbtVector3 vtx;
	cbtScalar newDot;

	{
		cbtVector3 pos(0, 0, 0);
		pos[getUpAxis()] = getHalfHeight();

		vtx = pos;
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}
	{
		cbtVector3 pos(0, 0, 0);
		pos[getUpAxis()] = -getHalfHeight();

		vtx = pos;
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}

	return supVec;
}